

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O2

int open_pty(char *prefix,int idx)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  termios options;
  char symname [128];
  
  __fd = open("/dev/ptmx",0x902);
  if (__fd < 0) {
    __fd = -1;
    if (((byte)loglevel & 1) != 0) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      syslog(3,"/dev/ptmx: %s",pcVar2);
    }
  }
  else {
    grantpt(__fd);
    unlockpt(__fd);
    pcVar2 = ptsname(__fd);
    snprintf(symname,0x80,"%s%d",prefix,idx);
    unlink(symname);
    iVar1 = symlink(pcVar2,symname);
    if ((iVar1 != 0) && (((byte)loglevel & 1) != 0)) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      syslog(3,"Symbolic link %s -> %s: %s.\n",symname,pcVar2,pcVar4);
    }
    tcgetattr(__fd,(termios *)&options);
    cfmakeraw((termios *)&options);
    tcsetattr(__fd,0,(termios *)&options);
  }
  return __fd;
}

Assistant:

int open_pty(const char *prefix, int idx) 
{
    int fd, oflags;
    char symname[128];
    struct termios options;
#if __QNX__
    int slave;
    char slavename[128];
    if(openpty(&fd, &slave, slavename, NULL, NULL) < 0) {
        LOGE("openpty: %s", strerror(errno));
        return -1;
    }
#else
    char *slavename;
    fd = open("/dev/ptmx", O_RDWR | O_NOCTTY | O_NONBLOCK);
    if(fd < 0) {
        LOGE("/dev/ptmx: %s", strerror(errno));
        return -1;
    }
	grantpt(fd); /* change permission of slave */
	unlockpt(fd); /* unlock slave */
	slavename = ptsname(fd); /* get name of slave */
#endif

    snprintf(symname, sizeof(symname), "%s%d", prefix, idx);
    unlink(symname);
    if (symlink(slavename, symname) != 0) {
        LOGE("Symbolic link %s -> %s: %s.\n", symname, slavename, strerror(errno));
    }

    // get the parameters
    tcgetattr(fd, &options);
    cfmakeraw(&options);

    tcsetattr(fd, TCSANOW, &options);

    //oflags = fcntl(fd, F_GETFL);
    //oflags |= (O_NONBLOCK | O_NOCTTY);
    //fcntl(fd, F_SETFL, oflags);

    return fd;
}